

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTOIDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall ParserTOIDecPOMDPDiscrete::ParseAgent(ParserTOIDecPOMDPDiscrete *this,Index id)

{
  MultiAgentDecisionProcessDiscrete *this_00;
  DecPOMDPDiscrete *this_01;
  long lVar1;
  E *this_02;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  ParserDPOMDPFormat_Spirit parser;
  
  this_00 = (this->_m_problem->super_TransitionObservationIndependentMADPDiscrete).
            _m_individualMADPDs.
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start[id];
  this_01 = (DecPOMDPDiscrete *)operator_new(0x230);
  std::__cxx11::string::string<std::allocator<char>>((string *)&parser,"",&local_1b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_1ba);
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&local_1b8,&this_00->super_MultiAgentDecisionProcess);
  DecPOMDPDiscrete::DecPOMDPDiscrete(this_01,(string *)&parser,&local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&parser);
  MultiAgentDecisionProcessDiscrete::SetSparse
            ((MultiAgentDecisionProcessDiscrete *)this_01,this_00->_m_sparse);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit(&parser,this_01);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::Parse(&parser);
  lVar1 = (**(code **)(*(long *)&(this_01->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x10))(this_01);
  if (lVar1 == 1) {
    (*(this->super_ParserInterface)._vptr_ParserInterface[3])(this,this_01,(ulong)id);
    DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::~ParserDPOMDPFormat_Spirit(&parser);
    return;
  }
  this_02 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_02,
       "ParserTOIDecPOMDPDiscrete::ParseAgent individual models can only be defined for a single agent"
      );
  __cxa_throw(this_02,&E::typeinfo,E::~E);
}

Assistant:

void ParserTOIDecPOMDPDiscrete::ParseAgent(Index id)
{
    MultiAgentDecisionProcessDiscrete* madp = 
        _m_problem->GetIndividualMADPD(id);

    DecPOMDPDiscrete *decpomdp;
    decpomdp=new DecPOMDPDiscrete("", "", madp->GetProblemFile());
    decpomdp->SetSparse(madp->GetSparse());

    DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit parser(decpomdp);
    parser.Parse();

    if(decpomdp->GetNrAgents()!=1)
        throw(E("ParserTOIDecPOMDPDiscrete::ParseAgent individual models can only be defined for a single agent"));

    StoreDecPOMDP(decpomdp,id);
}